

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void log_info(char *method,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (log_level != LOG_ERROR) {
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    print_time(_stdout);
    print_method(_stdout,method);
    local_d8 = local_c8;
    local_e0 = &args[0].overflow_arg_area;
    local_e8 = 0x3000000010;
    vprintf(format,&local_e8);
  }
  return;
}

Assistant:

void log_info(const char *method, const char *format, ...) {
    if(get_log_level() < LOG_INFO)
        return;

    print_time(stdout);
    print_method(stdout, method);

    va_list args;
    va_start(args, format);
    vprintf(format, args);
    va_end(args);
}